

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

optional<pbrt::BSDFSample> * __thiscall
pbrt::DielectricInterfaceBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,DielectricInterfaceBxDF *this,
          Vector3f wo,Float uc,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  TrowbridgeReitzDistribution *this_00;
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  undefined8 uVar14;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Float FVar24;
  anon_struct_4_0_00000001_for___align aVar25;
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float cd;
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  Vector3f VVar53;
  Vector3f wo_00;
  Vector3f wm;
  Vector3f wm_00;
  Tuple3<pbrt::Vector3,_float> local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Vector3f local_f8;
  Vector3f local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a4;
  uint local_a0;
  float local_9c;
  uint local_98;
  float local_94;
  Float local_90;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 auVar30 [64];
  undefined1 auVar37 [64];
  
  auVar36._4_60_ = wo._12_60_;
  auVar36._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar29._8_56_ = wo._8_56_;
  auVar29._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8 = auVar29._0_16_;
  local_f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(local_c8);
  local_118 = vmovshdup_avx(local_c8);
  auVar23 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                       ZEXT416((uint)(this->mfDistrib).alpha_x));
  auVar19 = auVar36._0_16_;
  local_f8.super_Tuple3<pbrt::Vector3,_float>.z = auVar36._0_4_;
  if (0.001 <= auVar23._0_4_) {
    this_00 = &this->mfDistrib;
    local_b8._0_4_ = uc;
    local_108 = auVar19;
    VVar53 = TrowbridgeReitzDistribution::Sample_wm(this_00,wo,u);
    auVar37._0_4_ = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar37._4_60_ = auVar36._4_60_;
    auVar30._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar30._8_56_ = auVar29._8_56_;
    auVar26 = auVar30._0_16_;
    auVar23 = vmovshdup_avx(auVar26);
    auVar51 = ZEXT816(0) << 0x40;
    local_e8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar26);
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * 0.0)),auVar26,auVar51);
    fVar16 = auVar37._0_4_ + auVar19._0_4_;
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_118._0_4_ * auVar23._0_4_)),local_c8,auVar26);
    auVar19 = vfmadd231ss_fma(auVar19,local_108,auVar37._0_16_);
    fVar15 = auVar19._0_4_ + auVar19._0_4_;
    auVar19._0_4_ = VVar53.super_Tuple3<pbrt::Vector3,_float>.x * fVar15;
    auVar19._4_4_ = VVar53.super_Tuple3<pbrt::Vector3,_float>.y * fVar15;
    fVar46 = auVar29._8_4_;
    auVar19._8_4_ = fVar46 * fVar15;
    fVar31 = auVar29._12_4_;
    auVar19._12_4_ = fVar31 * fVar15;
    fVar44 = local_108._0_4_;
    local_128.z = auVar37._0_4_ * fVar15 - fVar44;
    auVar19 = vsubps_avx(auVar19,local_c8);
    auVar17 = auVar26;
    if (fVar16 < 0.0) {
      auVar17._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      auVar17._8_4_ = -fVar46;
      auVar17._12_4_ = -fVar31;
    }
    uVar14 = vcmpss_avx512f(ZEXT416((uint)fVar16),auVar51,1);
    bVar4 = (bool)((byte)uVar14 & 1);
    auVar20._4_12_ = auVar36._4_12_;
    auVar20._0_4_ = (uint)bVar4 * (int)-auVar37._0_4_ + (uint)!bVar4 * (int)auVar37._0_4_;
    auVar47._0_4_ = auVar17._0_4_ * auVar19._0_4_;
    auVar47._4_4_ = auVar17._4_4_ * auVar19._4_4_;
    auVar47._8_4_ = auVar17._8_4_ * auVar19._8_4_;
    auVar47._12_4_ = auVar17._12_4_ * auVar19._12_4_;
    auVar21 = vmovshdup_avx(auVar47);
    auVar17 = vfmadd231ss_fma(auVar21,auVar19,auVar17);
    auVar21 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_128.z),auVar20);
    fVar16 = this->eta;
    local_88 = SUB6416(ZEXT464(0x3f800000),0);
    auVar17 = vminss_avx(local_88,auVar21);
    uVar14 = vcmpss_avx512f(local_88,auVar21,1);
    bVar4 = (bool)((byte)uVar14 & 1);
    bVar10 = auVar21._0_4_ < -1.0;
    fVar15 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar17._0_4_);
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar17 = vandps_avx512vl(auVar21,auVar22);
    bVar11 = 0.0 < fVar15;
    auVar21._4_12_ = auVar17._4_12_;
    auVar21._0_4_ =
         (uint)bVar11 * (int)fVar15 +
         (uint)!bVar11 *
         ((uint)bVar10 * 0x3f800000 +
         (uint)!bVar10 * ((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * auVar17._0_4_));
    fVar15 = (float)((uint)bVar11 * (int)fVar16 + (uint)!bVar11 * (int)(1.0 / fVar16));
    auVar22 = ZEXT416((uint)fVar15);
    auVar17 = vfnmadd213ss_fma(auVar21,auVar21,local_88);
    auVar17 = vmaxss_avx(auVar17,auVar51);
    auVar17 = vsqrtss_avx(auVar17,auVar17);
    auVar51._0_4_ = auVar17._0_4_ / fVar15;
    auVar51._4_12_ = auVar17._4_12_;
    if (auVar51._0_4_ < 1.0) {
      auVar17 = vfnmadd213ss_fma(auVar51,auVar51,ZEXT416(0x3f800000));
      auVar17 = vmaxss_avx(auVar17,ZEXT816(0) << 0x20);
      auVar17 = vsqrtss_avx(auVar17,auVar17);
      auVar20 = vfmsub213ss_fma(auVar21,auVar22,auVar17);
      auVar51 = vfmadd213ss_fma(auVar21,auVar22,auVar17);
      auVar52._0_4_ = auVar20._0_4_ / auVar51._0_4_;
      auVar52._4_12_ = auVar20._4_12_;
      auVar51 = vfnmadd213ss_fma(auVar17,auVar22,auVar21);
      auVar17 = vfmadd213ss_fma(auVar17,auVar22,auVar21);
      fVar15 = auVar51._0_4_ / auVar17._0_4_;
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar52,auVar52);
      local_88 = ZEXT416((uint)(auVar17._0_4_ * 0.5));
    }
    fVar15 = 1.0 - local_88._0_4_;
    local_d8._0_4_ = (uint)((byte)sampleFlags & 1) * (int)local_88._0_4_;
    local_d8._4_12_ = local_88._4_12_;
    local_78 = ZEXT416((uint)fVar15);
    fVar15 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar15);
    local_38 = ZEXT416((uint)fVar15);
    if ((((float)local_d8._0_4_ == 0.0) && (fVar15 == 0.0)) && (!NAN(fVar15))) {
LAB_0033fe35:
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      return __return_storage_ptr__;
    }
    local_68._0_4_ = (float)local_d8._0_4_ + fVar15;
    local_e8.super_Tuple3<pbrt::Vector3,_float>.z = auVar37._0_4_;
    if ((float)local_d8._0_4_ / ((float)local_d8._0_4_ + fVar15) <= (float)local_b8._0_4_) {
      auVar17 = ZEXT816(0) << 0x20;
      local_128.x = 0.0;
      local_128.y = 0.0;
      local_128.z = 0.0;
      uVar14 = vcmpss_avx512f(auVar17,local_108,1);
      bVar4 = (bool)((byte)uVar14 & 1);
      auVar23 = vfmadd213ss_fma(local_118,auVar23,ZEXT416((uint)(fVar44 * auVar37._0_4_)));
      auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar44 * auVar37._0_4_)),auVar37._0_16_,local_108);
      fVar16 = (float)((uint)bVar4 * (int)fVar16 + (uint)!bVar4 * (int)(1.0 / fVar16));
      local_d8 = ZEXT416((uint)fVar16);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar19._0_4_)),auVar26,local_c8);
      auVar23 = vfnmadd213ss_fma(auVar19,auVar19,SUB6416(ZEXT464(0x3f800000),0));
      auVar23 = vmaxss_avx(auVar23,auVar17);
      fVar15 = auVar23._0_4_ / (fVar16 * fVar16);
      local_118._0_4_ = fVar15;
      if (fVar15 < 1.0) {
        auVar23 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar15)),auVar17);
        auVar23 = vsqrtss_avx(auVar23,auVar23);
        fVar15 = auVar19._0_4_ / fVar16 - auVar23._0_4_;
        auVar23._4_4_ = fVar16;
        auVar23._0_4_ = fVar16;
        auVar23._8_4_ = fVar16;
        auVar23._12_4_ = fVar16;
        auVar23 = vdivps_avx(local_c8,auVar23);
        auVar26._0_4_ = VVar53.super_Tuple3<pbrt::Vector3,_float>.x * fVar15;
        auVar26._4_4_ = VVar53.super_Tuple3<pbrt::Vector3,_float>.y * fVar15;
        auVar26._8_4_ = fVar46 * fVar15;
        auVar26._12_4_ = fVar31 * fVar15;
        auVar23 = vsubps_avx(auVar26,auVar23);
        local_128._0_8_ = vmovlps_avx(auVar23);
        local_128.z = auVar37._0_4_ * fVar15 - fVar44 / fVar16;
      }
      if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
           ::reg == '\0') &&
         (iVar13 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                        ::reg), iVar13 != 0)) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                    ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                          ::StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                             ::reg);
      }
      *(long *)(in_FS_OFFSET + -0x118) = *(long *)(in_FS_OFFSET + -0x118) + 1;
      if (1.0 <= (float)local_118._0_4_) {
        *(long *)(in_FS_OFFSET + -0x120) = *(long *)(in_FS_OFFSET + -0x120) + 1;
      }
      if ((local_f8.super_Tuple3<pbrt::Vector3,_float>.z * local_128.z <= 0.0) &&
         ((float)local_118._0_4_ < 1.0)) {
        auVar23 = ZEXT816(0) << 0x40;
        local_8c = 0.0;
        if ((local_128.z != 0.0) || (NAN(local_128.z))) {
          local_118._8_8_ = 0;
          local_118._0_4_ = local_e8.super_Tuple3<pbrt::Vector3,_float>.x;
          local_118._4_4_ = local_e8.super_Tuple3<pbrt::Vector3,_float>.y;
          local_b8._0_4_ = local_128.z;
          local_88._0_4_ = local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar19 = vmovshdup_avx(local_118);
          auVar19 = vfmadd213ss_fma(auVar19,auVar23,
                                    ZEXT416((uint)local_e8.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ +
                                                  (local_e8.super_Tuple3<pbrt::Vector3,_float>.z -
                                                  local_e8.super_Tuple3<pbrt::Vector3,_float>.z))),
                                    local_118,auVar23);
          if (auVar19._0_4_ < 0.0) {
            local_118._0_8_ = local_e8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
            ;
            local_118._8_4_ = 0x80000000;
            local_118._12_4_ = 0x80000000;
          }
          uVar14 = vcmpss_avx512f(auVar19,auVar23,1);
          bVar4 = (bool)((byte)uVar14 & 1);
          local_c8 = vmovshdup_avx(local_118);
          fVar16 = (float)((uint)bVar4 * (int)-local_e8.super_Tuple3<pbrt::Vector3,_float>.z +
                          (uint)!bVar4 * (int)local_e8.super_Tuple3<pbrt::Vector3,_float>.z);
          local_108 = ZEXT416((uint)fVar16);
          fVar16 = fVar16 * fVar16;
          auVar23 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar16)),auVar23);
          fVar15 = auVar23._0_4_ / fVar16;
          if ((ABS(fVar15) != INFINITY) && (1e-16 <= fVar16 * fVar16)) {
            auVar23 = vsqrtss_avx(auVar23,auVar23);
            fVar46 = 0.0;
            auVar42._0_4_ = auVar23._0_4_;
            if ((auVar42._0_4_ != 0.0) || (NAN(auVar42._0_4_))) {
              auVar42._4_4_ = auVar42._0_4_;
              auVar42._8_4_ = auVar42._0_4_;
              auVar42._12_4_ = auVar42._0_4_;
              fVar31 = this_00->alpha_x;
              auVar23 = vdivps_avx(local_118,auVar42);
              auVar9._8_4_ = 0x3f800000;
              auVar9._0_8_ = 0x3f8000003f800000;
              auVar9._12_4_ = 0x3f800000;
              uVar3 = vcmpps_avx512vl(auVar23,auVar9,0xe);
              uVar14 = vcmpss_avx512f(auVar23,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar4 = (bool)((byte)uVar14 & 1);
              auVar19 = vmovshdup_avx(auVar23);
              bVar12 = (byte)(uVar3 >> 1);
              fVar46 = (float)((uint)bVar4 * -0x40800000 +
                              (uint)!bVar4 *
                              ((uint)((byte)uVar3 & 1) * 0x3f800000 +
                              (uint)!(bool)((byte)uVar3 & 1) * auVar23._0_4_));
              uVar14 = vcmpss_avx512f(auVar19,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar4 = (bool)((byte)uVar14 & 1);
              fVar44 = (fVar46 * fVar46) / (fVar31 * fVar31);
              fVar46 = (float)((uint)bVar4 * -0x40800000 +
                              (uint)!bVar4 *
                              ((uint)(bVar12 & 1) * 0x3f800000 +
                              (uint)!(bool)(bVar12 & 1) * auVar19._0_4_));
            }
            else {
              fVar31 = this_00->alpha_x;
              fVar44 = 1.0 / (fVar31 * fVar31);
            }
            fVar1 = (this->mfDistrib).alpha_y;
            fVar15 = fVar15 * (fVar44 + (fVar46 * fVar46) / (fVar1 * fVar1)) + 1.0;
            local_8c = 1.0 / (fVar16 * fVar16 * fVar31 * 3.1415927 * fVar1 * fVar15 * fVar15);
          }
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_c8._0_4_ * local_128.y)),local_118,
                                    ZEXT416((uint)local_128.x));
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_c8._0_4_ *
                                                  local_f8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    local_118,
                                    ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.x));
          local_98 = auVar23._0_4_;
          local_a0 = auVar19._0_4_;
          local_90 = TrowbridgeReitzDistribution::Lambda(this_00,&local_f8);
          local_9c = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_128);
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)((float)local_c8._0_4_ * local_128.y)),local_118,
                                    ZEXT416((uint)local_128.x));
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)((float)local_c8._0_4_ *
                                                  local_f8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    local_118,
                                    ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.x));
          local_94 = local_128.z;
          local_a4 = local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_128.z),local_108);
          auVar8._8_4_ = 0x7fffffff;
          auVar8._0_8_ = 0x7fffffff7fffffff;
          auVar8._12_4_ = 0x7fffffff;
          local_58 = vandps_avx512vl(auVar23,auVar8);
          local_48 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_f8.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),local_108);
          auVar23 = vfmadd132ss_fma(auVar23,local_48,ZEXT416((uint)local_d8._0_4_));
          local_c8._0_4_ = local_58._0_4_ / (auVar23._0_4_ * auVar23._0_4_);
          VVar53.super_Tuple3<pbrt::Vector3,_float>.z =
               local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
          VVar53.super_Tuple3<pbrt::Vector3,_float>.x =
               local_f8.super_Tuple3<pbrt::Vector3,_float>.x;
          VVar53.super_Tuple3<pbrt::Vector3,_float>.y =
               local_f8.super_Tuple3<pbrt::Vector3,_float>.y;
          wm_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_118._0_8_;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.z = local_108._0_4_;
          FVar24 = TrowbridgeReitzDistribution::PDF(this_00,VVar53,wm_00);
          fVar16 = (FVar24 * (float)local_c8._0_4_ * (float)local_38._0_4_) / (float)local_68._0_4_;
          if (NAN(fVar16)) {
            LogFatal<char_const(&)[12]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
                       ,0xe3,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
          }
          __return_storage_ptr__->set = true;
          auVar23 = vfmadd213ss_fma(ZEXT416((uint)local_88._0_4_),local_108,ZEXT416(local_a0));
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)local_b8._0_4_),local_108,ZEXT416(local_98));
          fVar15 = 1.0 / local_d8._0_4_;
          auVar17 = vfmadd213ss_fma(auVar19,local_d8,auVar23);
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar23 = vandps_avx(auVar43,local_48);
          auVar19 = vandps_avx(ZEXT416((uint)(local_a4 * local_94)),auVar43);
          auVar38._0_4_ =
               ((1.0 / (local_90 + 1.0 + local_9c)) * local_8c * (float)local_58._0_4_ *
               auVar23._0_4_) / (auVar17._0_4_ * auVar17._0_4_ * auVar19._0_4_);
          auVar38._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar23 = vandps_avx(auVar38,auVar43);
          aVar25 = (anon_struct_4_0_00000001_for___align)
                   ((float)((uint)(mode == Radiance) * (int)(fVar15 * fVar15) +
                           (uint)(mode != Radiance) * 0x3f800000) * (float)local_78._0_4_ *
                   auVar23._0_4_);
          (__return_storage_ptr__->optionalValue).__align = aVar25;
          *(anon_struct_4_0_00000001_for___align *)
           ((long)&__return_storage_ptr__->optionalValue + 4) = aVar25;
          *(anon_struct_4_0_00000001_for___align *)
           ((long)&__return_storage_ptr__->optionalValue + 8) = aVar25;
          *(anon_struct_4_0_00000001_for___align *)
           ((long)&__return_storage_ptr__->optionalValue + 0xc) = aVar25;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_128._0_8_;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_128.z;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar16;
          *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 10;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_d8._0_4_;
          goto LAB_003406e9;
        }
      }
      goto LAB_0033fe35;
    }
    local_128._0_8_ = vmovlps_avx(auVar19);
    if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar13 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar13 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x128) = *(long *)(in_FS_OFFSET + -0x128) + 1;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_f8.super_Tuple3<pbrt::Vector3,_float>.y *
                                            local_e8.super_Tuple3<pbrt::Vector3,_float>.y)),
                              ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.x),
                              ZEXT416((uint)local_e8.super_Tuple3<pbrt::Vector3,_float>.x));
    local_108 = ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.z);
    auVar23 = vfmadd231ss_fma(auVar23,local_108,
                              ZEXT416((uint)local_e8.super_Tuple3<pbrt::Vector3,_float>.z));
    if (auVar23._0_4_ <= 0.0) {
      *(long *)(in_FS_OFFSET + -0x130) = *(long *)(in_FS_OFFSET + -0x130) + 1;
      goto LAB_0033fe35;
    }
    if (local_f8.super_Tuple3<pbrt::Vector3,_float>.z * local_128.z <= 0.0) goto LAB_0033fe35;
    local_c8 = ZEXT416((uint)local_128.z);
    local_118._0_4_ = local_e8.super_Tuple3<pbrt::Vector3,_float>.z;
    local_b8._8_8_ = 0;
    local_b8._0_4_ = local_f8.super_Tuple3<pbrt::Vector3,_float>.x;
    local_b8._4_4_ = local_f8.super_Tuple3<pbrt::Vector3,_float>.y;
    local_78._8_8_ = 0;
    local_78._0_4_ = local_e8.super_Tuple3<pbrt::Vector3,_float>.x;
    local_78._4_4_ = local_e8.super_Tuple3<pbrt::Vector3,_float>.y;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_f8.super_Tuple3<pbrt::Vector3,_float>.x;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = local_f8.super_Tuple3<pbrt::Vector3,_float>.y;
    wm.super_Tuple3<pbrt::Vector3,_float>.z = local_e8.super_Tuple3<pbrt::Vector3,_float>.z;
    wm.super_Tuple3<pbrt::Vector3,_float>.x = local_e8.super_Tuple3<pbrt::Vector3,_float>.x;
    wm.super_Tuple3<pbrt::Vector3,_float>.y = local_e8.super_Tuple3<pbrt::Vector3,_float>.y;
    FVar24 = TrowbridgeReitzDistribution::PDF(this_00,wo_00,wm);
    auVar32._0_4_ = local_b8._0_4_ * local_78._0_4_;
    auVar32._4_4_ = local_b8._4_4_ * local_78._4_4_;
    auVar32._8_4_ = local_b8._8_4_ * local_78._8_4_;
    auVar32._12_4_ = local_b8._12_4_ * local_78._12_4_;
    auVar23 = vmovshdup_avx(auVar32);
    auVar23 = vfmadd231ss_fma(auVar23,local_b8,local_78);
    auVar23 = vfmadd231ss_fma(auVar23,local_108,ZEXT416((uint)local_118._0_4_));
    fVar16 = ((FVar24 / (auVar23._0_4_ * 4.0)) * (float)local_d8._0_4_) / (float)local_68._0_4_;
    if (NAN(fVar16)) {
      LogFatal<char_const(&)[12]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
                 ,0xbf,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
    }
    if (((local_108._0_4_ == 0.0) && (!NAN(local_108._0_4_))) ||
       (((float)local_c8._0_4_ == 0.0 && (!NAN((float)local_c8._0_4_))))) goto LAB_0033fe35;
    local_118._0_4_ = fVar16;
    local_d8._0_4_ = TrowbridgeReitzDistribution::D(this_00,&local_e8);
    FVar24 = TrowbridgeReitzDistribution::G(this_00,&local_f8,(Vector3f *)&local_128);
    auVar33._8_4_ = 0x7fffffff;
    auVar33._0_8_ = 0x7fffffff7fffffff;
    auVar33._12_4_ = 0x7fffffff;
    __return_storage_ptr__->set = true;
    uVar14 = 0x3f80000000000009;
    auVar23 = vandps_avx(auVar33,local_108);
    auVar19 = vandps_avx(auVar33,local_c8);
    aVar25 = (anon_struct_4_0_00000001_for___align)
             ((FVar24 * (float)local_d8._0_4_ * (float)local_88._0_4_) /
             (auVar23._0_4_ * auVar19._0_4_ * 4.0));
    (__return_storage_ptr__->optionalValue).__align = aVar25;
    *(anon_struct_4_0_00000001_for___align *)((long)&__return_storage_ptr__->optionalValue + 4) =
         aVar25;
    *(anon_struct_4_0_00000001_for___align *)((long)&__return_storage_ptr__->optionalValue + 8) =
         aVar25;
    *(anon_struct_4_0_00000001_for___align *)((long)&__return_storage_ptr__->optionalValue + 0xc) =
         aVar25;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_128._0_8_;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_128.z;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = local_118._0_4_;
  }
  else {
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar17 = vandps_avx512vl(auVar19,auVar5);
    fVar16 = this->eta;
    auVar26 = SUB6416(ZEXT464(0x3f800000),0);
    auVar23 = vminss_avx(auVar26,auVar19);
    uVar14 = vcmpss_avx512f(auVar26,auVar19,1);
    bVar4 = (bool)((byte)uVar14 & 1);
    bVar10 = auVar36._0_4_ < -1.0;
    fVar15 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar23._0_4_);
    iVar13 = auVar17._0_4_;
    auVar18._4_12_ = auVar17._4_12_;
    bVar11 = 0.0 < fVar15;
    auVar18._0_4_ =
         (uint)bVar11 * (int)fVar15 +
         (uint)!bVar11 *
         ((uint)bVar10 * 0x3f800000 +
         (uint)!bVar10 * ((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * iVar13));
    fVar15 = (float)((uint)bVar11 * (int)fVar16 + (uint)!bVar11 * (int)(1.0 / fVar16));
    auVar17 = ZEXT416((uint)fVar15);
    auVar23 = vfnmadd213ss_fma(auVar18,auVar18,auVar26);
    auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x40);
    auVar23 = vsqrtss_avx(auVar23,auVar23);
    auVar49._0_4_ = auVar23._0_4_ / fVar15;
    auVar49._4_12_ = auVar23._4_12_;
    if (auVar49._0_4_ < 1.0) {
      auVar23 = vfnmadd213ss_fma(auVar49,auVar49,ZEXT416(0x3f800000));
      auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x40);
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      auVar51 = vfmsub213ss_fma(auVar18,auVar17,auVar23);
      auVar26 = vfmadd213ss_fma(auVar18,auVar17,auVar23);
      auVar50._0_4_ = auVar51._0_4_ / auVar26._0_4_;
      auVar50._4_12_ = auVar51._4_12_;
      auVar26 = vfnmadd213ss_fma(auVar23,auVar17,auVar18);
      auVar23 = vfmadd213ss_fma(auVar23,auVar17,auVar18);
      fVar15 = auVar26._0_4_ / auVar23._0_4_;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar50,auVar50);
      auVar26 = ZEXT416((uint)(auVar23._0_4_ * 0.5));
    }
    fVar44 = auVar26._0_4_;
    fVar15 = 1.0 - fVar44;
    fVar46 = (float)((uint)((byte)sampleFlags & 1) * (int)fVar44);
    fVar31 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar15);
    if ((((fVar46 == 0.0) && (!NAN(fVar46))) && (fVar31 == 0.0)) && (!NAN(fVar31)))
    goto LAB_0033fe35;
    local_d8._0_4_ = fVar46 + fVar31;
    fVar46 = fVar46 / (fVar46 + fVar31);
    if (fVar46 <= uc) {
      auVar40._0_12_ = ZEXT812(0);
      auVar40._12_4_ = 0;
      uVar14 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar19,1);
      bVar4 = (bool)((byte)uVar14 & 1);
      auVar23 = vfmadd213ss_fma(auVar40,local_118,auVar19);
      fVar16 = (float)((uint)bVar4 * (int)fVar16 + (uint)!bVar4 * (int)(1.0 / fVar16));
      local_108 = ZEXT416((uint)fVar16);
      local_88 = ZEXT816(0) << 0x20;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)((auVar36._0_4_ - auVar36._0_4_) + auVar23._0_4_)),
                                local_c8,ZEXT816(0) << 0x40);
      if (auVar23._0_4_ < 0.0) {
        auVar48._8_4_ = 0x80000000;
        auVar48._0_8_ = 0x8000000080000000;
        auVar48._12_4_ = 0x80000000;
      }
      else {
        auVar48._0_12_ = ZEXT812(0);
        auVar48._12_4_ = 0;
      }
      auVar17 = vmovshdup_avx(auVar48);
      local_b8 = ZEXT816(0) << 0x20;
      uVar14 = vcmpss_avx512f(auVar23,ZEXT816(0) << 0x40,1);
      bVar4 = (bool)((byte)uVar14 & 1);
      fVar46 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * 0x3f800000);
      local_68 = ZEXT416((uint)(fVar16 * fVar16));
      auVar23 = vfmadd213ss_fma(local_118,auVar17,ZEXT416((uint)(fVar46 * auVar36._0_4_)));
      auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar46 * auVar36._0_4_)),ZEXT416((uint)fVar46),
                                auVar19);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar19._0_4_)),auVar48,local_c8);
      auVar23 = vfnmadd213ss_fma(auVar19,auVar19,SUB6416(ZEXT464(0x3f800000),0));
      auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x40);
      fVar44 = auVar23._0_4_ / (fVar16 * fVar16);
      local_78._0_4_ = fVar44;
      if (fVar44 < 1.0) {
        auVar23 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar44)),ZEXT816(0) << 0x20);
        auVar23 = vsqrtss_avx(auVar23,auVar23);
        fVar44 = auVar19._0_4_ / fVar16 - auVar23._0_4_;
        auVar41._4_4_ = fVar16;
        auVar41._0_4_ = fVar16;
        auVar41._8_4_ = fVar16;
        auVar41._12_4_ = fVar16;
        auVar23 = vdivps_avx(local_c8,auVar41);
        auVar27._0_4_ = auVar48._0_4_ * fVar44;
        auVar27._4_4_ = auVar48._4_4_ * fVar44;
        auVar27._8_4_ = auVar48._8_4_ * fVar44;
        auVar27._12_4_ = auVar48._12_4_ * fVar44;
        local_88 = vsubps_avx(auVar27,auVar23);
        local_b8 = ZEXT416((uint)(fVar46 * fVar44 - auVar36._0_4_ / fVar16));
      }
      local_118 = ZEXT416((uint)fVar31);
      local_c8 = ZEXT416((uint)fVar15);
      if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
           ::reg == '\0') &&
         (iVar13 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                        ::reg), iVar13 != 0)) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                    ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                          ::StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                             ::reg);
      }
      *(long *)(in_FS_OFFSET + -0x138) = *(long *)(in_FS_OFFSET + -0x138) + 1;
      if (1.0 <= (float)local_78._0_4_) {
        *(long *)(in_FS_OFFSET + -0x140) = *(long *)(in_FS_OFFSET + -0x140) + 1;
        goto LAB_0033fe35;
      }
      auVar34._4_4_ = local_b8._0_4_;
      auVar34._0_4_ = local_b8._0_4_;
      auVar34._8_4_ = local_b8._0_4_;
      auVar34._12_4_ = local_b8._0_4_;
      auVar28._0_4_ = (float)local_c8._0_4_ * (this->tint).values.values[0];
      auVar28._4_4_ = (float)local_c8._0_4_ * (this->tint).values.values[1];
      auVar28._8_4_ = (float)local_c8._0_4_ * (this->tint).values.values[2];
      auVar28._12_4_ = (float)local_c8._0_4_ * (this->tint).values.values[3];
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl(auVar34,auVar7);
      auVar23 = vdivps_avx(auVar28,auVar23);
      if (mode == Radiance) {
        auVar35._4_4_ = local_68._0_4_;
        auVar35._0_4_ = local_68._0_4_;
        auVar35._8_4_ = local_68._0_4_;
        auVar35._12_4_ = local_68._0_4_;
        auVar23 = vdivps_avx(auVar23,auVar35);
      }
      auVar19 = vshufpd_avx(auVar23,auVar23,1);
      __return_storage_ptr__->set = true;
      auVar23 = vunpcklpd_avx(auVar23,auVar19);
      *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar23;
      uVar14 = vmovlps_avx(local_88);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar14;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_b8._0_4_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
           (float)local_118._0_4_ / (float)local_d8._0_4_;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0x12;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_108._0_4_;
      goto LAB_003406e9;
    }
    auVar39._0_4_ = fVar44 * (this->tint).values.values[0];
    auVar39._4_4_ = fVar44 * (this->tint).values.values[1];
    auVar39._8_4_ = fVar44 * (this->tint).values.values[2];
    auVar39._12_4_ = fVar44 * (this->tint).values.values[3];
    auVar45._4_4_ = iVar13;
    auVar45._0_4_ = iVar13;
    auVar45._8_4_ = iVar13;
    auVar45._12_4_ = iVar13;
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar19 = vxorps_avx512vl(local_c8,auVar6);
    uVar14 = 0x3f80000000000011;
    __return_storage_ptr__->set = true;
    auVar23 = vdivps_avx(auVar39,auVar45);
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar23;
    uVar2 = vmovlps_avx(auVar19);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar36._0_4_;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar46;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uVar14;
LAB_003406e9:
  (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<BSDFSample> DielectricInterfaceBxDF::Sample_f(
    Vector3f wo, Float uc, Point2f u, TransportMode mode,
    BxDFReflTransFlags sampleFlags) const {
    if (mfDistrib.EffectivelySmooth()) {
        // Sample delta dielectric interface
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular reflection at interface
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(tint * R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular transmission at interface
            // Figure out which $\eta$ is incident and which is transmitted
            bool entering = CosTheta(wo) > 0;
            Float etap = entering ? eta : (1 / eta);

            // Compute ray direction for specular transmission
            Vector3f wi;
            bool tir = !Refract(wo, FaceForward(Normal3f(0, 0, 1), wo), etap, &wi);
            CHECK_RARE(1e-5f, tir);
            if (tir)
                return {};

            SampledSpectrum ft(tint * T / AbsCosTheta(wi));
            // Account for non-symmetry with transmission to different medium
            if (mode == TransportMode::Radiance)
                ft /= Sqr(etap);

            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission,
                              etap);
        }

    } else {
        // Sample non-delta dielectric interface
        // Sample half-angle vector for outgoing direction and compute Frensel factor
        Vector3f wh = mfDistrib.Sample_wm(wo, u);
        Float F =
            FrDielectric(Dot(Reflect(wo, wh), FaceForward(wh, Vector3f(0, 0, 1))), eta);
        Float R = F, T = 1 - R;

        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample reflection at non-delta dielectric interface
            Vector3f wi = Reflect(wo, wh);
            CHECK_RARE(1e-5f, Dot(wo, wh) <= 0);
            if (!SameHemisphere(wo, wi) || Dot(wo, wh) <= 0)
                return {};
            // Compute PDF of direction $\wi$ for microfacet reflection
            Float pdf = mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);
            CHECK(!IsNaN(pdf));

            // Evaluate BRDF and return _BSDFSample_ for dielectric microfacet reflection
            Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return {};
            SampledSpectrum f(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                              (4 * cosTheta_i * cosTheta_o));
            return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

        } else {
            // Sample transmission at non-delta dielectric interface
            Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
            Vector3f wi;
            bool tir = !Refract(wo, (Normal3f)wh, etap, &wi);
            CHECK_RARE(1e-5f, tir);
            if (SameHemisphere(wo, wi))
                return {};
            if (tir || wi.z == 0)
                return {};

            // Evaluate BSDF
            wh = FaceForward(wh, Normal3f(0, 0, 1));

            Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
            Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;

            SampledSpectrum f(
                (1 - F) * factor *
                std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * AbsDot(wi, wh) *
                         AbsDot(wo, wh) /
                         (AbsCosTheta(wi) * AbsCosTheta(wo) * Sqr(sqrtDenom))));

            Float dwh_dwi =
                /*Sqr(etap) * */ AbsDot(wi, wh) / Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
            Float pdf = mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
            CHECK(!IsNaN(pdf));

            return BSDFSample(f, wi, pdf, BxDFFlags::GlossyTransmission, etap);
        }
    }
}